

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space_mixer.c
# Opt level: O1

void calculate_pitch_shift(space_source *source,space_mixer_data *listener)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  fVar6 = listener->doppler_factor;
  if (fVar6 <= 0.0) {
    fVar6 = 1.0;
  }
  else {
    fVar3 = listener->location[0] - source->location[0];
    fVar4 = listener->location[1] - source->location[1];
    fVar5 = listener->location[2] - source->location[2];
    fVar8 = listener->soundspeed;
    fVar7 = fVar5 * fVar5 + fVar3 * fVar3 + fVar4 * fVar4;
    if (fVar7 < 0.0) {
      fVar7 = sqrtf(fVar7);
    }
    else {
      auVar2 = vsqrtss_avx(ZEXT416((uint)fVar7),ZEXT416((uint)fVar7));
      fVar7 = auVar2._0_4_;
    }
    auVar2 = vminss_avx(ZEXT416((uint)(fVar7 * (fVar5 * source->velocity[2] +
                                               fVar3 * source->velocity[0] +
                                               fVar4 * source->velocity[1]))),
                        ZEXT416((uint)(fVar8 / fVar6)));
    auVar1 = vminss_avx(ZEXT416((uint)(fVar7 * (fVar5 * listener->velocity[2] +
                                               fVar3 * listener->velocity[0] +
                                               fVar4 * listener->velocity[1]))),
                        ZEXT416((uint)(fVar8 / fVar6)));
    fVar8 = (fVar8 - fVar6 * auVar1._0_4_) / (fVar8 - fVar6 * auVar2._0_4_);
    fVar6 = 0.5;
    if ((0.5 <= fVar8) && (fVar6 = 2.0, fVar8 < 2.0)) {
      fVar6 = fVar8;
    }
  }
  source->pitch = fVar6;
  return;
}

Assistant:

VECTORIZE static void calculate_pitch_shift(struct space_source *source, struct space_mixer_data *listener){
  if(listener->doppler_factor <= 0.0){
    source->pitch = 1.0;
    return;
  }
  // See OpenAL1.1 specification §3.5.2
  float SL[3] = {listener->location[0] - source->location[0],
                 listener->location[1] - source->location[1],
                 listener->location[2] - source->location[2]};
  float *SV = source->velocity;
  float *LV = listener->velocity;
  float SS = listener->soundspeed;
  float DF = listener->doppler_factor;
  float Mag = vec_length(SL);
  float vls = vec_dot(SL, LV) * Mag;
  float vss = vec_dot(SL, SV) * Mag;
  float SS_DF = SS/DF;
  vss = MIN(vss, SS_DF);
  vls = MIN(vls, SS_DF);
  float pitch = CLAMP(0.5, (SS - DF*vls) / (SS - DF*vss), 2.0);
  source->pitch = pitch;
}